

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync.cpp
# Opt level: O0

ByteBuffer * __thiscall
bidfx_public_api::price::pixie::SubscriptionSync::Encode
          (ByteBuffer *__return_storage_ptr__,SubscriptionSync *this,int version)

{
  bool bVar1;
  uint8_t data;
  reference to_copy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arr;
  size_type sVar2;
  pointer ppVar3;
  uint32_t value;
  uint32_t value_00;
  uint32_t value_01;
  uint32_t value_02;
  uint32_t value_03;
  ZLIBBufferCompressor *local_170;
  uint local_15c;
  ByteBuffer local_130;
  _Base_ptr local_100;
  _Self local_f8;
  _Self local_f0;
  const_iterator itt;
  Subject subject;
  const_iterator __end3;
  const_iterator __begin3;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *__range3;
  ByteBuffer subject_buffer;
  BufferCompressor *compressor;
  undefined1 local_50 [8];
  ByteBuffer message_frame;
  int version_local;
  SubscriptionSync *this_local;
  
  message_frame.capacity_._4_4_ = version;
  tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_50,0x2000);
  tools::ByteBuffer::WriteByte((ByteBuffer *)local_50,'S');
  if (message_frame.capacity_._4_4_ < 2) {
    local_15c = this->options_ & 1;
  }
  else {
    local_15c = this->options_;
  }
  tools::Varint::WriteU32((Varint *)&message_frame,(OutputStream *)(ulong)local_15c,value);
  tools::Varint::WriteU32((Varint *)&message_frame,(OutputStream *)(ulong)this->edition_,value_00);
  tools::Varint::WriteU32
            ((Varint *)&message_frame,(OutputStream *)(ulong)(uint)this->size_,value_01);
  bVar1 = IsCompressed(this);
  subject_buffer.capacity_._7_1_ = 0;
  if (bVar1) {
    local_170 = (ZLIBBufferCompressor *)operator_new(0xa8);
    tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_170,5);
  }
  else {
    local_170 = (ZLIBBufferCompressor *)operator_new(0x38);
    subject_buffer.capacity_._7_1_ = 1;
    (local_170->stream_).next_out = (Bytef *)0x0;
    *(undefined8 *)&(local_170->stream_).avail_out = 0;
    *(undefined8 *)&(local_170->stream_).avail_in = 0;
    (local_170->stream_).total_in = 0;
    (local_170->super_BufferCompressor)._vptr_BufferCompressor = (_func_int **)0x0;
    (local_170->stream_).next_in = (Bytef *)0x0;
    (local_170->stream_).total_out = 0;
    tools::UncompressedBufferCompressor::UncompressedBufferCompressor
              ((UncompressedBufferCompressor *)local_170);
  }
  tools::ByteBuffer::ByteBuffer((ByteBuffer *)&__range3,0x2000);
  bVar1 = IsChangedEdition(this);
  if (bVar1) {
    __end3 = std::
             vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ::begin(&this->subjects_);
    subject.components_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  ::end(&this->subjects_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                                       *)&subject.components_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1
          ) {
      to_copy = __gnu_cxx::
                __normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                ::operator*(&__end3);
      price::subject::Subject::Subject((Subject *)&itt,to_copy);
      arr = price::subject::Subject::GetComponents_abi_cxx11_((Subject *)&itt);
      tools::Varint::WriteStringVector((OutputStream *)&subject_buffer,arr);
      (**(local_170->super_BufferCompressor)._vptr_BufferCompressor)(local_170,&__range3);
      price::subject::Subject::~Subject((Subject *)&itt);
      __gnu_cxx::
      __normal_iterator<const_bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
      ::operator++(&__end3);
    }
  }
  bVar1 = HasControls(this);
  if ((bVar1) && (1 < message_frame.capacity_._4_4_)) {
    sVar2 = std::
            map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
            ::size(&this->controls_);
    tools::Varint::WriteU32((Varint *)&subject_buffer,(OutputStream *)(sVar2 & 0xffffffff),value_02)
    ;
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
         ::begin(&this->controls_);
    while( true ) {
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
           ::end(&this->controls_);
      bVar1 = std::operator!=(&local_f0,&local_f8);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
               ::operator->(&local_f0);
      tools::Varint::WriteU32
                ((Varint *)&subject_buffer,(OutputStream *)(ulong)ppVar3->first,value_03);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
               ::operator->(&local_f0);
      data = ControlOperation::GetCode(ppVar3->second);
      tools::ByteBuffer::WriteByte((ByteBuffer *)&__range3,data);
      local_100 = (_Base_ptr)
                  std::
                  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>
                  ::operator++(&local_f0,0);
    }
    (**(local_170->super_BufferCompressor)._vptr_BufferCompressor)(local_170,&__range3);
  }
  (*(local_170->super_BufferCompressor)._vptr_BufferCompressor[1])(&local_130);
  tools::ByteBuffer::WriteBytes((ByteBuffer *)local_50,&local_130);
  tools::ByteBuffer::~ByteBuffer(&local_130);
  if (local_170 != (ZLIBBufferCompressor *)0x0) {
    operator_delete(local_170,8);
  }
  tools::ByteBuffer::ByteBuffer(__return_storage_ptr__,(ByteBuffer *)local_50);
  tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&__range3);
  tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_50);
  return __return_storage_ptr__;
}

Assistant:

ByteBuffer SubscriptionSync::Encode(int version) const
{
    ByteBuffer message_frame;
    message_frame.WriteByte(PixieMessageType::SUBSCRIPTION_SYNC);
    Varint::WriteU32(message_frame, (unsigned int) (version < PixieVersion::VERSION2 ? options_ & 1 : options_));
    Varint::WriteU32(message_frame, (unsigned int) edition_);
    Varint::WriteU32(message_frame, (unsigned int) size_);

    BufferCompressor* compressor = IsCompressed() ? (BufferCompressor*) new ZLIBBufferCompressor(5) : (BufferCompressor*) new UncompressedBufferCompressor();
    ByteBuffer subject_buffer;

    if (IsChangedEdition())
    {
        for (Subject subject : subjects_)
        {
            Varint::WriteStringVector(subject_buffer, subject.GetComponents());
            compressor->Compress(subject_buffer);
        }
    }
    if (HasControls() && version >= PixieVersion::VERSION2)
    {
        Varint::WriteU32(subject_buffer, static_cast<unsigned int>(controls_.size()));

        for (auto itt = controls_.begin(); itt != controls_.end(); itt ++)
        {
            Varint::WriteU32(subject_buffer, (unsigned int) itt->first);
            subject_buffer.WriteByte(ControlOperation::GetCode(itt->second));
        }
        compressor->Compress(subject_buffer);
    }

    message_frame.WriteBytes(compressor->GetCompressed());
    delete compressor;
    return std::move(message_frame);
}